

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O0

streamsize __thiscall NJamSpell::MemStream::xsputn(MemStream *this,char *s,streamsize n)

{
  size_t *psVar1;
  long local_38;
  size_t local_30;
  long toCopy;
  streamsize n_local;
  char *s_local;
  MemStream *this_local;
  
  this_local = (MemStream *)n;
  if (0 < n) {
    local_38 = this->MaxSize - this->Pos;
    toCopy = n;
    n_local = (streamsize)s;
    s_local = (char *)this;
    psVar1 = (size_t *)std::min<long>(&toCopy,&local_38);
    local_30 = *psVar1;
    memcpy(this->Buff + this->Pos,(void *)n_local,local_30);
    this->Pos = local_30 + this->Pos;
    this_local = (MemStream *)toCopy;
  }
  return (streamsize)this_local;
}

Assistant:

std::streamsize xsputn(const char* s, std::streamsize n) override {
        if (n <= 0) {
            return n;
        }
        long toCopy = std::min<long>(n, MaxSize - Pos);
        memcpy(Buff + Pos, s, toCopy);
        Pos += toCopy;
        return n;
    }